

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_gen_image_color(rf_image *__return_storage_ptr__,int width,int height,rf_color color,
                  rf_allocator allocator)

{
  rf_source_location rVar1;
  undefined1 auVar2 [24];
  undefined1 auVar3 [16];
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  uint uStack_54;
  rf_allocator local_38;
  
  local_38.allocator_proc = allocator.allocator_proc;
  local_38.user_data = allocator.user_data;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  uVar7 = height * width;
  rVar1.proc_name = "rf_gen_image_color";
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.line_in_file = 0x4186;
  auVar2._8_8_ = (ulong)uStack_54 << 0x20;
  auVar2._0_8_ = (long)(int)(uVar7 * 4);
  auVar2._16_8_ = 0;
  pvVar4 = (*local_38.allocator_proc)
                     (&local_38,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar2 << 0x40));
  auVar3 = _DAT_00177b60;
  if (pvVar4 != (void *)0x0) {
    if (0 < (int)uVar7) {
      lVar5 = (ulong)uVar7 - 1;
      auVar8._8_4_ = (int)lVar5;
      auVar8._0_8_ = lVar5;
      auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar6 = 0;
      auVar8 = auVar8 ^ _DAT_00177b60;
      auVar10 = _DAT_00177d50;
      auVar11 = _DAT_00177d60;
      do {
        auVar12 = auVar11 ^ auVar3;
        iVar9 = auVar8._4_4_;
        if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ || iVar9 < auVar12._4_4_
                    ) & 1)) {
          *(rf_color *)((long)pvVar4 + uVar6 * 4) = color;
        }
        if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
            auVar12._12_4_ <= auVar8._12_4_) {
          *(rf_color *)((long)pvVar4 + uVar6 * 4 + 4) = color;
        }
        auVar12 = auVar10 ^ auVar3;
        iVar13 = auVar12._4_4_;
        if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar12._0_4_ <= auVar8._0_4_)) {
          *(rf_color *)((long)pvVar4 + uVar6 * 4 + 8) = color;
          *(rf_color *)((long)pvVar4 + uVar6 * 4 + 0xc) = color;
        }
        uVar6 = uVar6 + 4;
        lVar5 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 4;
        auVar11._8_8_ = lVar5 + 4;
        lVar5 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 4;
        auVar10._8_8_ = lVar5 + 4;
      } while ((uVar7 + 3 & 0xfffffffc) != uVar6);
    }
    __return_storage_ptr__->data = pvVar4;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_color(int width, int height, rf_color color, rf_allocator allocator)
{
    rf_image result = {0};

    int dst_size = width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
    void* dst = RF_ALLOC(allocator, dst_size);

    if (dst)
    {
        result = rf_gen_image_color_to_buffer(width, height, color, dst, width * height);
    }

    return result;
}